

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monmove.c
# Opt level: O0

void monflee(monst *mtmp,int fleetime,boolean first,boolean fleemsg)

{
  boolean bVar1;
  byte bVar2;
  uchar local_1c;
  int local_14;
  boolean fleemsg_local;
  boolean first_local;
  int fleetime_local;
  monst *mtmp_local;
  
  if (u.ustuck == mtmp) {
    if ((u._1052_1_ & 1) == 0) {
      bVar1 = sticks(youmonst.data);
      if (bVar1 == '\0') {
        unstuck(mtmp);
        pline("You get released!");
      }
    }
    else {
      expels(mtmp,mtmp->data,'\x01');
    }
  }
  if ((first != '\0') && ((*(uint *)&mtmp->field_0x60 >> 0x10 & 1) != 0)) goto LAB_0025508e;
  if (fleetime == 0) {
    mtmp->mfleetim = '\0';
  }
  else if (((*(uint *)&mtmp->field_0x60 >> 0x10 & 1) == 0) || (mtmp->mfleetim != '\0')) {
    local_14 = (uint)mtmp->mfleetim + fleetime;
    if (local_14 == 1) {
      local_14 = 2;
    }
    if (local_14 < 0x7f) {
      local_1c = (uchar)local_14;
    }
    else {
      local_1c = '\x7f';
    }
    mtmp->mfleetim = local_1c;
  }
  if (((*(uint *)&mtmp->field_0x60 >> 0x10 & 1) == 0) && (fleemsg != '\0')) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if ((((u.uprops[0x1e].intrinsic != 0) ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
            ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
           (((u.uprops[0x40].intrinsic == 0 &&
             ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
            ((mtmp->data->mflags3 & 0x200) == 0)))) goto LAB_00255078;
        bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
        goto joined_r0x00254f92;
      }
    }
    else {
      bVar2 = worm_known(level,mtmp);
joined_r0x00254f92:
      if (bVar2 == 0) goto LAB_00255078;
    }
    if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
         (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
       ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)
         ) && ((((byte)u._1052_1_ >> 5 & 1) == 0 && (mtmp->mfrozen == '\0')))))) {
      if (mtmp->data->mlet == '\r') {
        Monnam(mtmp);
        pline("%s mimics a chicken for a moment!");
      }
      else {
        Monnam(mtmp);
        pline("%s turns to flee!");
      }
    }
  }
LAB_00255078:
  *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfffeffff | 0x10000;
LAB_0025508e:
  memset(mtmp->mtrack,0,8);
  return;
}

Assistant:

void monflee(struct monst *mtmp, int fleetime, boolean first, boolean fleemsg)
{
	if (u.ustuck == mtmp) {
	    if (u.uswallow)
		expels(mtmp, mtmp->data, TRUE);
	    else if (!sticks(youmonst.data)) {
		unstuck(mtmp);	/* monster lets go when fleeing */
		pline("You get released!");
	    }
	}

	if (!first || !mtmp->mflee) {
	    /* don't lose untimed scare */
	    if (!fleetime)
		mtmp->mfleetim = 0;
	    else if (!mtmp->mflee || mtmp->mfleetim) {
		fleetime += mtmp->mfleetim;
		/* ensure monster flees long enough to visibly stop fighting */
		if (fleetime == 1) fleetime++;
		mtmp->mfleetim = min(fleetime, 127);
	    }
	    if (!mtmp->mflee && fleemsg && canseemon(level, mtmp) && !mtmp->mfrozen) {
		if (mtmp->data->mlet != S_MIMIC)
		    pline("%s turns to flee!", (Monnam(mtmp)));
		else
		    pline("%s mimics a chicken for a moment!", (Monnam(mtmp)));
	    }
	    mtmp->mflee = 1;
	}

	/* ignore recently-stepped spaces when made to flee */
	memset(mtmp->mtrack, 0, sizeof(mtmp->mtrack));
}